

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

log_entry * __thiscall log_queue::pop_top(log_queue *this)

{
  size_type sVar1;
  log_entry *plVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->queue_mutex);
  while( true ) {
    sVar1 = std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::size
                      ((deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)
                       this);
    if ((sVar1 != 0) || (this->active != true)) break;
    std::condition_variable::wait((unique_lock *)&this->wait_for_next_item_condition);
  }
  if (this->active == true) {
    plVar2 = *(this->queue).c.
              super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::pop_front
              ((deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)this);
  }
  else {
    plVar2 = (log_entry *)0x0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return plVar2;
}

Assistant:

log_entry* pop_top() {
            std::unique_lock<std::mutex> lock(queue_mutex);
            while ((queue.size() == 0) && (active == true)) {
                wait_for_next_item_condition.wait(lock);
            }

            if (!active) {
                return nullptr;
            }

            log_entry* top = queue.front();
            queue.pop();
            return top;
        }